

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeIncrSwap(IncrMerger *pIncr)

{
  sqlite3_file *psVar1;
  i64 iVar2;
  SorterFile f0;
  int rc;
  IncrMerger *pIncr_local;
  
  if (pIncr->bUseThread == 0) {
    f0.iEof._4_4_ = vdbeIncrPopulate(pIncr);
    pIncr->aFile[0].pFd = pIncr->aFile[1].pFd;
    pIncr->aFile[0].iEof = pIncr->aFile[1].iEof;
    if (pIncr->aFile[0].iEof == pIncr->iStartOff) {
      pIncr->bEof = 1;
    }
  }
  else {
    f0.iEof._4_4_ = vdbeSorterJoinThread(pIncr->pTask);
    if (f0.iEof._4_4_ == 0) {
      psVar1 = pIncr->aFile[0].pFd;
      iVar2 = pIncr->aFile[0].iEof;
      pIncr->aFile[0].pFd = pIncr->aFile[1].pFd;
      pIncr->aFile[0].iEof = pIncr->aFile[1].iEof;
      pIncr->aFile[1].pFd = psVar1;
      pIncr->aFile[1].iEof = iVar2;
      if (pIncr->aFile[0].iEof == pIncr->iStartOff) {
        pIncr->bEof = 1;
      }
      else {
        f0.iEof._4_4_ = vdbeIncrBgPopulate(pIncr);
      }
    }
  }
  return f0.iEof._4_4_;
}

Assistant:

static int vdbeIncrSwap(IncrMerger *pIncr){
  int rc = SQLITE_OK;

#if SQLITE_MAX_WORKER_THREADS>0
  if( pIncr->bUseThread ){
    rc = vdbeSorterJoinThread(pIncr->pTask);

    if( rc==SQLITE_OK ){
      SorterFile f0 = pIncr->aFile[0];
      pIncr->aFile[0] = pIncr->aFile[1];
      pIncr->aFile[1] = f0;
    }

    if( rc==SQLITE_OK ){
      if( pIncr->aFile[0].iEof==pIncr->iStartOff ){
        pIncr->bEof = 1;
      }else{
        rc = vdbeIncrBgPopulate(pIncr);
      }
    }
  }else
#endif
  {
    rc = vdbeIncrPopulate(pIncr);
    pIncr->aFile[0] = pIncr->aFile[1];
    if( pIncr->aFile[0].iEof==pIncr->iStartOff ){
      pIncr->bEof = 1;
    }
  }

  return rc;
}